

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFlowAnalysis.cpp
# Opt level: O0

void __thiscall
slang::analysis::DataFlowAnalysis::handle(DataFlowAnalysis *this,EventTriggerStatement *stmt)

{
  AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState> *in_RSI;
  EventTriggerStatement *in_RDI;
  DataFlowAnalysis *unaff_retaddr;
  
  if (*(long *)&(in_RSI->super_FlowAnalysisBase).evalContext.astCtx.lookupIndex != 0) {
    handleTiming(unaff_retaddr,(TimingControl *)in_RDI);
  }
  AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>::visitStmt
            (in_RSI,in_RDI);
  return;
}

Assistant:

void DataFlowAnalysis::handle(const EventTriggerStatement& stmt) {
    if (stmt.timing)
        handleTiming(*stmt.timing);
    visitStmt(stmt);
}